

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastLess_rec(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,int *pYes,int *pNo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint nBits_00;
  int NoR;
  int YesR;
  int local_38;
  int local_34;
  
  if (nBits < 2) {
    if (nBits != 1) {
      __assert_fail("nBits == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x12f,"void Wlc_BlastLess_rec(Gia_Man_t *, int *, int *, int, int *, int *)");
    }
    iVar1 = Abc_LitNot(*pArg0);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,*pArg1);
    *pYes = iVar1;
    iVar1 = Abc_LitNot(*pArg1);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,*pArg0);
    *pNo = iVar1;
  }
  else {
    nBits_00 = nBits - 1;
    iVar1 = Abc_LitNot(pArg0[nBits_00]);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,pArg1[nBits_00]);
    iVar2 = Abc_LitNot(pArg1[nBits_00]);
    iVar2 = Gia_ManHashAnd(pNew,iVar2,pArg0[nBits_00]);
    if (iVar2 == 1 || iVar1 == 1) {
      *pYes = iVar1;
    }
    else {
      Wlc_BlastLess_rec(pNew,pArg0,pArg1,nBits_00,&local_34,&local_38);
      iVar3 = Abc_LitNot(iVar2);
      iVar3 = Gia_ManHashAnd(pNew,iVar3,local_34);
      iVar3 = Gia_ManHashOr(pNew,iVar1,iVar3);
      *pYes = iVar3;
      iVar1 = Abc_LitNot(iVar1);
      iVar1 = Gia_ManHashAnd(pNew,iVar1,local_38);
      iVar2 = Gia_ManHashOr(pNew,iVar2,iVar1);
    }
    *pNo = iVar2;
  }
  return;
}

Assistant:

void Wlc_BlastLess_rec( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, int * pYes, int * pNo )
{
    if ( nBits > 1 )
    {
        int Yes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[nBits-1]), pArg1[nBits-1] ), YesR;
        int No  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[nBits-1]), pArg0[nBits-1] ), NoR;
        if ( Yes == 1 || No == 1 )
        {
            *pYes = Yes;
            *pNo  = No;
            return;
        }
        Wlc_BlastLess_rec( pNew, pArg0, pArg1, nBits-1, &YesR, &NoR );
        *pYes = Gia_ManHashOr( pNew, Yes, Gia_ManHashAnd(pNew, Abc_LitNot(No),  YesR) );
        *pNo  = Gia_ManHashOr( pNew, No,  Gia_ManHashAnd(pNew, Abc_LitNot(Yes), NoR ) );
        return;
    }
    assert( nBits == 1 );
    *pYes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[0]), pArg1[0] );
    *pNo  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[0]), pArg0[0] );
}